

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O0

int ttf_font_descent(ALLEGRO_FONT *f)

{
  FT_Face_conflict face;
  ALLEGRO_TTF_FONT_DATA *data;
  ALLEGRO_FONT *f_local;
  
  return (int)(-*(long *)(*(long *)(*f->data + 0xa0) + 0x38) >> 6);
}

Assistant:

static int ttf_font_descent(ALLEGRO_FONT const *f)
{
    ALLEGRO_TTF_FONT_DATA *data;
    FT_Face face;

    ASSERT(f);

    data = f->data;
    face = data->face;

    return (-face->size->metrics.descender) >> 6;
}